

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler
          (IMUElasticLocalFrameDynamicalSystem *this,Vector3 *positionCom,Vector3 *velocityCom,
          Vector3 *accelerationCom,Vector3 *AngMomentum,Vector3 *dotAngMomentum,Matrix3 *inertia,
          Matrix3 *dotInertia,IndexedMatrixArray *contactPos,IndexedMatrixArray *contactOri,
          Vector3 *position,Vector3 *linVelocity,Vector *fc,Vector3 *oriVector,Vector3 *angularVel,
          Vector *tc,Vector3 *fm,Vector3 *tm,Vector3 *addiForces,Vector3 *addiMoments,double dt)

{
  Matrix3 *other;
  Scalar *scalar;
  StorageBaseType *matrix;
  Matrix<double,_3,_1,_0,_3,_1> *local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_90;
  double local_68;
  double dt_local;
  Vector3 *dotAngMomentum_local;
  Vector3 *AngMomentum_local;
  Vector3 *accelerationCom_local;
  Vector3 *velocityCom_local;
  Vector3 *positionCom_local;
  IMUElasticLocalFrameDynamicalSystem *this_local;
  
  local_68 = dt;
  dt_local = (double)dotAngMomentum;
  dotAngMomentum_local = AngMomentum;
  AngMomentum_local = accelerationCom;
  accelerationCom_local = velocityCom;
  velocityCom_local = positionCom;
  positionCom_local = (Vector3 *)this;
  other = computeRotation_(this,oriVector,0);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=(&(this->op_).rFlex,other);
  (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[10])
            (this,velocityCom_local,accelerationCom_local,AngMomentum_local,dotAngMomentum_local,
             dt_local,inertia,dotInertia,contactPos,contactOri,position,linVelocity,
             &(this->op_).linearAcceleration,oriVector,&(this->op_).rFlex,angularVel,
             &(this->op_).angularAcceleration,fc,tc,fm,tm,addiForces,addiMoments);
  algorithm::RigidBodyKinematics::integrateKinematics
            ((RigidBodyKinematics *)this,position,linVelocity,&(this->op_).linearAcceleration,
             &(this->op_).rFlex,angularVel,&(this->op_).angularAcceleration,local_68);
  Eigen::AngleAxis<double>::operator=
            (&(this->op_).orientationAA,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&(this->op_).rFlex);
  scalar = Eigen::AngleAxis<double>::angle(&(this->op_).orientationAA);
  matrix = (StorageBaseType *)Eigen::AngleAxis<double>::axis(&(this->op_).orientationAA);
  Eigen::operator*(&local_90,scalar,matrix);
  local_98 = (Matrix<double,_3,_1,_0,_3,_1> *)
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)oriVector);
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_98,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_90);
  computeForcesAndMoments
            (this,contactPos,contactOri,&(this->op_).contactVelArray,&(this->op_).contactAngVelArray
             ,position,linVelocity,oriVector,&(this->op_).rFlex,angularVel,fc,tc);
  return;
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler
             (const Vector3& positionCom, const Vector3& velocityCom,
              const Vector3& accelerationCom, const Vector3& AngMomentum,
              const Vector3& dotAngMomentum,
              const Matrix3& inertia, const Matrix3& dotInertia,
              const IndexedMatrixArray& contactPos,
              const IndexedMatrixArray& contactOri,
              Vector3& position, Vector3& linVelocity, Vector& fc,
              Vector3 &oriVector, Vector3& angularVel, Vector& tc,
              const Vector3 & fm, const Vector3& tm, const Vector3 &addiForces,
              const Vector3 & addiMoments,
              double dt)
    {

        op_.rFlex = computeRotation_(oriVector,0);
        //compute new acceleration with the current flex position and velocity and input

//        computeForcesAndMoments (contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray,
//                          position, linVelocity, oriVector, op_.rFlex,
//                             angularVel, fc, tc);

        computeAccelerations (positionCom, velocityCom,
        accelerationCom, AngMomentum, dotAngMomentum,
        inertia, dotInertia,  contactPos, contactOri, position, linVelocity, op_.linearAcceleration,
                       oriVector, op_.rFlex, angularVel, op_.angularAcceleration,
                       fc, tc, fm,tm, addiForces, addiMoments);

        //integrate kinematics with the last acceleration
        integrateKinematics(position, linVelocity, op_.linearAcceleration,
            op_.rFlex,angularVel, op_.angularAcceleration, dt);

        op_.orientationAA=op_.rFlex;
        oriVector.noalias()=op_.orientationAA.angle()*op_.orientationAA.axis();

        computeForcesAndMoments (contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray,
                          position, linVelocity, oriVector, op_.rFlex,
                             angularVel, fc, tc);
    }